

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O3

bool __thiscall SocketInternals::Close(SocketInternals *this)

{
  ostream *this_00;
  int iVar1;
  int *piVar2;
  long *plVar3;
  bool bVar4;
  
  bVar4 = true;
  if (this->SocketFD != -1) {
    iVar1 = close(this->SocketFD);
    if (iVar1 == 0) {
      this->SocketFD = -1;
    }
    else {
      this_00 = this->outStr;
      std::__ostream_insert<char,std::char_traits<char>>
                (this_00,"Close: failed to close socket, Error: ",0x26);
      piVar2 = __errno_location();
      plVar3 = (long *)std::ostream::operator<<((ostream *)this_00,*piVar2);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool SocketInternals::Close()
{
    if (SocketFD != INVALID_SOCKET) {
#ifdef _MSC_VER
        if (closesocket(SocketFD) != 0) {
            outStr << "Close: failed to close socket, Error: " << WSAGetLastError() <<std::endl;
            return false;
        }
        WSACleanup();
#else
        if (close(SocketFD) != 0) {
            outStr << "Close: failed to close socket, Error: " << errno << std::endl;
            return false;
        }
#endif
        SocketFD = INVALID_SOCKET;
    }
    return true;
}